

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad2(int n,memory_buf_t *dest)

{
  format_args args;
  string_view fmt;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aVar1;
  v8 *in_RSI;
  int in_EDI;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  *paVar2;
  buffer<char> *in_stack_fffffffffffffef0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_108;
  char *local_100;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *local_f8;
  char local_ea;
  char local_e9;
  undefined1 local_dc [36];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbVar3;
  back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_> out;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_90;
  char *pcStack_88;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *local_80;
  char *local_70;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  *local_68;
  char *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  *local_58;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  *local_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  char local_20 [8];
  undefined1 *local_18;
  undefined1 *local_10;
  char *local_8;
  
  if ((in_EDI < 0) || (99 < in_EDI)) {
    local_f8 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)
               std::back_inserter<fmt::v8::basic_memory_buffer<char,250ul,std::allocator<char>>>
                         (in_stack_fffffffffffffee8);
    paVar2 = &local_108;
    local_70 = "{:02}";
    local_60 = "{:02}";
    local_108.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)0x1d4202;
    local_68 = paVar2;
    local_58 = paVar2;
    aVar1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
             )std::char_traits<char>::length((char_type *)0x145cb8);
    paVar2[1] = aVar1;
    local_8 = local_70;
    local_80 = local_f8;
    local_90.values_ = local_108.values_;
    pcStack_88 = local_100;
    out.container = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_dc;
    local_50 = &local_90;
    local_48.values_ = local_108.values_;
    pbVar3 = local_f8;
    local_dc._4_8_ =
         ::fmt::v8::make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int&>
                   ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *
                    )out.container,in_RSI,(int *)local_f8);
    local_30 = local_dc + 0x1c;
    local_38 = local_dc + 4;
    local_20[0] = '\x01';
    local_20[1] = '\0';
    local_20[2] = '\0';
    local_20[3] = '\0';
    local_20[4] = '\0';
    local_20[5] = '\0';
    local_20[6] = '\0';
    local_20[7] = '\0';
    local_dc._28_8_ = 1;
    fmt.size_ = (size_t)pbVar3;
    fmt.data_ = local_100;
    args.field_1.values_ = local_108.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v8::
    vformat_to<std::back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_0>
              (out,fmt,args);
  }
  else {
    local_e9 = (char)(in_EDI / 10) + '0';
    local_dc._0_4_ = in_EDI;
    ::fmt::v8::detail::buffer<char>::push_back
              (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_ea = (char)((int)local_dc._0_4_ % 10) + '0';
    ::fmt::v8::detail::buffer<char>::push_back
              (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  }
  return;
}

Assistant:

inline void pad2(int n, memory_buf_t &dest)
{
    if (n >= 0 && n < 100) // 0-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    }
    else // unlikely, but just in case, let fmt deal with it
    {
        fmt_lib::format_to(std::back_inserter(dest), "{:02}", n);
    }
}